

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O1

void __thiscall
vkt::sr::anon_unknown_0::LinearDerivateCase::LinearDerivateCase
          (LinearDerivateCase *this,TestContext *testCtx,string *name,string *description,
          DerivateFunc func,DataType type,Precision precision,SurfaceType surfaceType,int numSamples
          ,string *fragmentSrcTmpl,BaseUniformType usedDefaultUniform)

{
  pointer pcVar1;
  DerivateCaseValues *pDVar2;
  UniformSetup *this_00;
  
  this_00 = (UniformSetup *)operator_new(0x18);
  UniformSetup::UniformSetup(this_00);
  *(undefined1 *)&this_00[1]._vptr_UniformSetup = 0;
  this_00->_vptr_UniformSetup = (_func_int **)&PTR__UniformSetup_00d5ab50;
  *(BaseUniformType *)((long)&this_00[1]._vptr_UniformSetup + 4) = usedDefaultUniform;
  ShaderRenderCase::ShaderRenderCase
            ((ShaderRenderCase *)this,testCtx,name,description,false,(ShaderEvaluator *)0x0,this_00,
             (AttributeSetupFunc)0x0);
  (this->super_TriangleDerivateCase).m_definitions.func = DERIVATE_LAST;
  (this->super_TriangleDerivateCase).m_definitions.dataType = TYPE_LAST;
  (this->super_TriangleDerivateCase).m_definitions.precision = PRECISION_LAST;
  (this->super_TriangleDerivateCase).m_definitions.coordDataType = TYPE_LAST;
  (this->super_TriangleDerivateCase).m_definitions.coordPrecision = PRECISION_LAST;
  (this->super_TriangleDerivateCase).m_definitions.surfaceType = SURFACETYPE_UNORM_FBO;
  (this->super_TriangleDerivateCase).m_definitions.numSamples = 0;
  (this->super_TriangleDerivateCase).m_values.coordMin.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_values.coordMin.m_data[1] = 0.0;
  pDVar2 = &(this->super_TriangleDerivateCase).m_values;
  (pDVar2->coordMin).m_data[2] = 0.0;
  (pDVar2->coordMin).m_data[3] = 0.0;
  (this->super_TriangleDerivateCase).m_values.coordMax.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_values.coordMax.m_data[1] = 0.0;
  pDVar2 = &(this->super_TriangleDerivateCase).m_values;
  (pDVar2->coordMax).m_data[2] = 0.0;
  (pDVar2->coordMax).m_data[3] = 0.0;
  (this->super_TriangleDerivateCase).m_values.derivScale.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_values.derivScale.m_data[1] = 0.0;
  pDVar2 = &(this->super_TriangleDerivateCase).m_values;
  (pDVar2->derivScale).m_data[2] = 0.0;
  (pDVar2->derivScale).m_data[3] = 0.0;
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[1] = 0.0;
  pDVar2 = &(this->super_TriangleDerivateCase).m_values;
  (pDVar2->derivBias).m_data[2] = 0.0;
  (pDVar2->derivBias).m_data[3] = 0.0;
  (this->super_TriangleDerivateCase).super_ShaderRenderCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__LinearDerivateCase_00d5aaf0;
  (this->m_fragmentTmpl)._M_dataplus._M_p = (pointer)&(this->m_fragmentTmpl).field_2;
  pcVar1 = (fragmentSrcTmpl->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_fragmentTmpl,pcVar1,pcVar1 + fragmentSrcTmpl->_M_string_length);
  (this->super_TriangleDerivateCase).m_definitions.func = func;
  (this->super_TriangleDerivateCase).m_definitions.dataType = type;
  (this->super_TriangleDerivateCase).m_definitions.precision = precision;
  (this->super_TriangleDerivateCase).m_definitions.coordDataType = type;
  (this->super_TriangleDerivateCase).m_definitions.coordPrecision = precision;
  (this->super_TriangleDerivateCase).m_definitions.surfaceType = surfaceType;
  (this->super_TriangleDerivateCase).m_definitions.numSamples = numSamples;
  return;
}

Assistant:

LinearDerivateCase::LinearDerivateCase (tcu::TestContext&		testCtx,
										const std::string&		name,
										const std::string&		description,
										DerivateFunc			func,
										glu::DataType			type,
										glu::Precision			precision,
										SurfaceType				surfaceType,
										int						numSamples,
										const std::string&		fragmentSrcTmpl,
										BaseUniformType			usedDefaultUniform)
	: TriangleDerivateCase	(testCtx, name, description, new LinearDerivateUniformSetup(false, usedDefaultUniform))
	, m_fragmentTmpl		(fragmentSrcTmpl)
{
	m_definitions.func				= func;
	m_definitions.dataType			= type;
	m_definitions.precision			= precision;
	m_definitions.coordDataType		= m_definitions.dataType;
	m_definitions.coordPrecision	= m_definitions.precision;
	m_definitions.surfaceType		= surfaceType;
	m_definitions.numSamples		= numSamples;
}